

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O0

string * __thiscall OpenMD::DumpWriter::prepareDumpLine_abi_cxx11_(DumpWriter *this,StuntDouble *sd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  uint uVar8;
  double *pdVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  StuntDouble *in_RDX;
  long in_RSI;
  string *in_RDI;
  Vector3d trq;
  Vector3d frc;
  Vector3d ji;
  Quat4d q;
  Vector3d vel;
  Vector3d pos;
  char tempBuffer [4096];
  string line;
  string type;
  int index;
  Quaternion<double> *in_stack_ffffffffffffea68;
  undefined4 in_stack_ffffffffffffea70;
  undefined4 in_stack_ffffffffffffea74;
  StuntDouble *in_stack_ffffffffffffea78;
  allocator<char> *in_stack_ffffffffffffeaa0;
  double *in_stack_ffffffffffffeaa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeab0;
  allocator<char> local_1179;
  Vector<double,_3U> local_1178;
  Vector<double,_3U> local_1160 [3];
  Vector<double,_3U> local_1110;
  Vector<double,_4U> local_10f8 [2];
  Vector<double,_3U> local_10a8;
  Vector<double,_3U> local_1090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1078 [128];
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [36];
  uint local_1c;
  
  local_1c = StuntDouble::getGlobalIntegrableObjectIndex(in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffeab0,(char *)in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::string(local_78);
  Vector3<double>::Vector3((Vector3<double> *)0x154fc0);
  Vector3<double>::Vector3((Vector3<double> *)0x154fcf);
  StuntDouble::getPos(in_stack_ffffffffffffea78);
  Vector3<double>::operator=
            ((Vector3<double> *)CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70),
             (Vector3<double> *)in_stack_ffffffffffffea68);
  pdVar9 = Vector<double,_3U>::operator[](&local_1090,0);
  uVar8 = std::isinf(*pdVar9);
  if ((uVar8 & 1) == 0) {
    pdVar9 = Vector<double,_3U>::operator[](&local_1090,0);
    uVar8 = std::isnan(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_0015519e;
    pdVar9 = Vector<double,_3U>::operator[](&local_1090,1);
    uVar8 = std::isinf(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_0015519e;
    pdVar9 = Vector<double,_3U>::operator[](&local_1090,1);
    uVar8 = std::isnan(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_0015519e;
    pdVar9 = Vector<double,_3U>::operator[](&local_1090,2);
    uVar8 = std::isinf(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_0015519e;
    pdVar9 = Vector<double,_3U>::operator[](&local_1090,2);
    uVar8 = std::isnan(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_0015519e;
  }
  else {
LAB_0015519e:
    snprintf(painCave.errMsg,2000,
             "DumpWriter detected a numerical error writing the position for object %d",
             (ulong)local_1c);
    painCave.isFatal = 1;
    simError();
  }
  StuntDouble::getVel(in_stack_ffffffffffffea78);
  Vector3<double>::operator=
            ((Vector3<double> *)CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70),
             (Vector3<double> *)in_stack_ffffffffffffea68);
  pdVar9 = Vector<double,_3U>::operator[](&local_10a8,0);
  uVar8 = std::isinf(*pdVar9);
  if ((uVar8 & 1) == 0) {
    pdVar9 = Vector<double,_3U>::operator[](&local_10a8,0);
    uVar8 = std::isnan(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_001553eb;
    pdVar9 = Vector<double,_3U>::operator[](&local_10a8,1);
    uVar8 = std::isinf(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_001553eb;
    pdVar9 = Vector<double,_3U>::operator[](&local_10a8,1);
    uVar8 = std::isnan(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_001553eb;
    pdVar9 = Vector<double,_3U>::operator[](&local_10a8,2);
    uVar8 = std::isinf(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_001553eb;
    pdVar9 = Vector<double,_3U>::operator[](&local_10a8,2);
    uVar8 = std::isnan(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_001553eb;
  }
  else {
LAB_001553eb:
    snprintf(painCave.errMsg,2000,
             "DumpWriter detected a numerical error writing the velocity for object %d",
             (ulong)local_1c);
    painCave.isFatal = 1;
    simError();
  }
  pdVar9 = Vector<double,_3U>::operator[](&local_1090,0);
  dVar1 = *pdVar9;
  pdVar9 = Vector<double,_3U>::operator[](&local_1090,1);
  dVar2 = *pdVar9;
  pdVar9 = Vector<double,_3U>::operator[](&local_1090,2);
  dVar3 = *pdVar9;
  pdVar9 = Vector<double,_3U>::operator[](&local_10a8,0);
  dVar4 = *pdVar9;
  pdVar9 = Vector<double,_3U>::operator[](&local_10a8,1);
  dVar5 = *pdVar9;
  pdVar9 = Vector<double,_3U>::operator[](&local_10a8,2);
  snprintf((char *)local_1078,0x1000,"%18.10g %18.10g %18.10g %13e %13e %13e",dVar1,dVar2,dVar3,
           dVar4,dVar5,*pdVar9);
  std::__cxx11::string::operator+=(local_78,(char *)local_1078);
  bVar7 = StuntDouble::isDirectional
                    ((StuntDouble *)CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70));
  if (bVar7) {
    std::__cxx11::string::operator+=(local_40,"qj");
    Quaternion<double>::Quaternion((Quaternion<double> *)0x1555fe);
    Vector3<double>::Vector3((Vector3<double> *)0x15560d);
    StuntDouble::getQ(in_stack_ffffffffffffea78);
    Quaternion<double>::operator=
              ((Quaternion<double> *)CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70),
               in_stack_ffffffffffffea68);
    pdVar9 = Vector<double,_4U>::operator[](local_10f8,0);
    uVar8 = std::isinf(*pdVar9);
    if ((uVar8 & 1) == 0) {
      pdVar9 = Vector<double,_4U>::operator[](local_10f8,0);
      uVar8 = std::isnan(*pdVar9);
      if ((uVar8 & 1) != 0) goto LAB_00155867;
      pdVar9 = Vector<double,_4U>::operator[](local_10f8,1);
      uVar8 = std::isinf(*pdVar9);
      if ((uVar8 & 1) != 0) goto LAB_00155867;
      pdVar9 = Vector<double,_4U>::operator[](local_10f8,1);
      uVar8 = std::isnan(*pdVar9);
      if ((uVar8 & 1) != 0) goto LAB_00155867;
      pdVar9 = Vector<double,_4U>::operator[](local_10f8,2);
      uVar8 = std::isinf(*pdVar9);
      if ((uVar8 & 1) != 0) goto LAB_00155867;
      pdVar9 = Vector<double,_4U>::operator[](local_10f8,2);
      uVar8 = std::isnan(*pdVar9);
      if ((uVar8 & 1) != 0) goto LAB_00155867;
      pdVar9 = Vector<double,_4U>::operator[](local_10f8,3);
      uVar8 = std::isinf(*pdVar9);
      if ((uVar8 & 1) != 0) goto LAB_00155867;
      pdVar9 = Vector<double,_4U>::operator[](local_10f8,3);
      uVar8 = std::isnan(*pdVar9);
      if ((uVar8 & 1) != 0) goto LAB_00155867;
    }
    else {
LAB_00155867:
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the quaternion for object %d",
               (ulong)local_1c);
      painCave.isFatal = 1;
      simError();
    }
    StuntDouble::getJ(in_stack_ffffffffffffea78);
    Vector3<double>::operator=
              ((Vector3<double> *)CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70),
               (Vector3<double> *)in_stack_ffffffffffffea68);
    pdVar9 = Vector<double,_3U>::operator[](&local_1110,0);
    uVar8 = std::isinf(*pdVar9);
    if ((uVar8 & 1) == 0) {
      pdVar9 = Vector<double,_3U>::operator[](&local_1110,0);
      uVar8 = std::isnan(*pdVar9);
      if ((uVar8 & 1) != 0) goto LAB_00155a75;
      pdVar9 = Vector<double,_3U>::operator[](&local_1110,1);
      uVar8 = std::isinf(*pdVar9);
      if ((uVar8 & 1) != 0) goto LAB_00155a75;
      pdVar9 = Vector<double,_3U>::operator[](&local_1110,1);
      uVar8 = std::isnan(*pdVar9);
      if ((uVar8 & 1) != 0) goto LAB_00155a75;
      pdVar9 = Vector<double,_3U>::operator[](&local_1110,2);
      uVar8 = std::isinf(*pdVar9);
      if ((uVar8 & 1) != 0) goto LAB_00155a75;
      pdVar9 = Vector<double,_3U>::operator[](&local_1110,2);
      uVar8 = std::isnan(*pdVar9);
      if ((uVar8 & 1) != 0) goto LAB_00155a75;
    }
    else {
LAB_00155a75:
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the angular momentum for object %d",
               (ulong)local_1c);
      painCave.isFatal = 1;
      simError();
    }
    pdVar9 = Vector<double,_4U>::operator[](local_10f8,0);
    dVar1 = *pdVar9;
    pdVar9 = Vector<double,_4U>::operator[](local_10f8,1);
    dVar2 = *pdVar9;
    pdVar9 = Vector<double,_4U>::operator[](local_10f8,2);
    dVar3 = *pdVar9;
    pdVar9 = Vector<double,_4U>::operator[](local_10f8,3);
    dVar4 = *pdVar9;
    pdVar9 = Vector<double,_3U>::operator[](&local_1110,0);
    dVar5 = *pdVar9;
    pdVar9 = Vector<double,_3U>::operator[](&local_1110,1);
    dVar6 = *pdVar9;
    pdVar9 = Vector<double,_3U>::operator[](&local_1110,2);
    snprintf((char *)local_1078,0x1000," %13e %13e %13e %13e %13e %13e %13e",dVar1,dVar2,dVar3,dVar4
             ,dVar5,dVar6,*pdVar9);
    std::__cxx11::string::operator+=(local_78,(char *)local_1078);
  }
  if ((*(byte *)(in_RSI + 0x51) & 1) == 0) goto LAB_00156241;
  std::__cxx11::string::operator+=(local_40,"f");
  StuntDouble::getFrc(in_stack_ffffffffffffea78);
  pdVar9 = Vector<double,_3U>::operator[](local_1160,0);
  uVar8 = std::isinf(*pdVar9);
  if ((uVar8 & 1) == 0) {
    pdVar9 = Vector<double,_3U>::operator[](local_1160,0);
    uVar8 = std::isnan(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_00155e56;
    pdVar9 = Vector<double,_3U>::operator[](local_1160,1);
    uVar8 = std::isinf(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_00155e56;
    pdVar9 = Vector<double,_3U>::operator[](local_1160,1);
    uVar8 = std::isnan(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_00155e56;
    pdVar9 = Vector<double,_3U>::operator[](local_1160,2);
    uVar8 = std::isinf(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_00155e56;
    pdVar9 = Vector<double,_3U>::operator[](local_1160,2);
    uVar8 = std::isnan(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_00155e56;
  }
  else {
LAB_00155e56:
    snprintf(painCave.errMsg,2000,
             "DumpWriter detected a numerical error writing the force for object %d",(ulong)local_1c
            );
    painCave.isFatal = 1;
    simError();
  }
  pdVar9 = Vector<double,_3U>::operator[](local_1160,0);
  dVar1 = *pdVar9;
  pdVar9 = Vector<double,_3U>::operator[](local_1160,1);
  dVar2 = *pdVar9;
  pdVar9 = Vector<double,_3U>::operator[](local_1160,2);
  snprintf((char *)local_1078,0x1000," %13e %13e %13e",dVar1,dVar2,*pdVar9);
  std::__cxx11::string::operator+=(local_78,(char *)local_1078);
  bVar7 = StuntDouble::isDirectional
                    ((StuntDouble *)CONCAT44(in_stack_ffffffffffffea74,in_stack_ffffffffffffea70));
  if (!bVar7) goto LAB_00156241;
  std::__cxx11::string::operator+=(local_40,"t");
  StuntDouble::getTrq(in_stack_ffffffffffffea78);
  pdVar9 = Vector<double,_3U>::operator[](&local_1178,0);
  uVar8 = std::isinf(*pdVar9);
  if ((uVar8 & 1) == 0) {
    pdVar9 = Vector<double,_3U>::operator[](&local_1178,0);
    uVar8 = std::isnan(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_00156148;
    pdVar9 = Vector<double,_3U>::operator[](&local_1178,1);
    uVar8 = std::isinf(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_00156148;
    pdVar9 = Vector<double,_3U>::operator[](&local_1178,1);
    uVar8 = std::isnan(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_00156148;
    pdVar9 = Vector<double,_3U>::operator[](&local_1178,2);
    uVar8 = std::isinf(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_00156148;
    pdVar9 = Vector<double,_3U>::operator[](&local_1178,2);
    uVar8 = std::isnan(*pdVar9);
    if ((uVar8 & 1) != 0) goto LAB_00156148;
  }
  else {
LAB_00156148:
    snprintf(painCave.errMsg,2000,
             "DumpWriter detected a numerical error writing the torque for object %d",
             (ulong)local_1c);
    painCave.isFatal = 1;
    simError();
  }
  in_stack_ffffffffffffeab0 = local_1078;
  pdVar9 = Vector<double,_3U>::operator[](&local_1178,0);
  in_stack_ffffffffffffeaa0 = (allocator<char> *)*pdVar9;
  in_stack_ffffffffffffeaa8 = Vector<double,_3U>::operator[](&local_1178,1);
  dVar1 = *in_stack_ffffffffffffeaa8;
  pdVar9 = Vector<double,_3U>::operator[](&local_1178,2);
  snprintf((char *)in_stack_ffffffffffffeab0,0x1000," %13e %13e %13e",in_stack_ffffffffffffeaa0,
           dVar1,*pdVar9);
  std::__cxx11::string::operator+=(local_78,(char *)local_1078);
LAB_00156241:
  uVar8 = local_1c;
  uVar10 = std::__cxx11::string::c_str();
  uVar11 = std::__cxx11::string::c_str();
  snprintf((char *)local_1078,0x1000,"%10d %7s %s\n",(ulong)uVar8,uVar10,uVar11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffeab0,(char *)in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
  std::allocator<char>::~allocator(&local_1179);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string DumpWriter::prepareDumpLine(StuntDouble* sd) {
    int index = sd->getGlobalIntegrableObjectIndex();
    std::string type("pv");
    std::string line;
    char tempBuffer[4096];

    Vector3d pos;
    Vector3d vel;
    pos = sd->getPos();

    if (std::isinf(pos[0]) || std::isnan(pos[0]) || std::isinf(pos[1]) ||
        std::isnan(pos[1]) || std::isinf(pos[2]) || std::isnan(pos[2])) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the position"
               " for object %d",
               index);
      painCave.isFatal = 1;
      simError();
    }

    vel = sd->getVel();

    if (std::isinf(vel[0]) || std::isnan(vel[0]) || std::isinf(vel[1]) ||
        std::isnan(vel[1]) || std::isinf(vel[2]) || std::isnan(vel[2])) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpWriter detected a numerical error writing the velocity"
               " for object %d",
               index);
      painCave.isFatal = 1;
      simError();
    }

    snprintf(tempBuffer, 4096, "%18.10g %18.10g %18.10g %13e %13e %13e", pos[0],
             pos[1], pos[2], vel[0], vel[1], vel[2]);
    line += tempBuffer;

    if (sd->isDirectional()) {
      type += "qj";
      Quat4d q;
      Vector3d ji;
      q = sd->getQ();

      if (std::isinf(q[0]) || std::isnan(q[0]) || std::isinf(q[1]) ||
          std::isnan(q[1]) || std::isinf(q[2]) || std::isnan(q[2]) ||
          std::isinf(q[3]) || std::isnan(q[3])) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpWriter detected a numerical error writing the quaternion"
                 " for object %d",
                 index);
        painCave.isFatal = 1;
        simError();
      }

      ji = sd->getJ();

      if (std::isinf(ji[0]) || std::isnan(ji[0]) || std::isinf(ji[1]) ||
          std::isnan(ji[1]) || std::isinf(ji[2]) || std::isnan(ji[2])) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpWriter detected a numerical error writing the angular"
                 " momentum for object %d",
                 index);
        painCave.isFatal = 1;
        simError();
      }

      snprintf(tempBuffer, 4096, " %13e %13e %13e %13e %13e %13e %13e", q[0],
               q[1], q[2], q[3], ji[0], ji[1], ji[2]);
      line += tempBuffer;
    }

    if (needForceVector_) {
      type += "f";
      Vector3d frc = sd->getFrc();
      if (std::isinf(frc[0]) || std::isnan(frc[0]) || std::isinf(frc[1]) ||
          std::isnan(frc[1]) || std::isinf(frc[2]) || std::isnan(frc[2])) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "DumpWriter detected a numerical error writing the force"
                 " for object %d",
                 index);
        painCave.isFatal = 1;
        simError();
      }
      snprintf(tempBuffer, 4096, " %13e %13e %13e", frc[0], frc[1], frc[2]);
      line += tempBuffer;

      if (sd->isDirectional()) {
        type += "t";
        Vector3d trq = sd->getTrq();
        if (std::isinf(trq[0]) || std::isnan(trq[0]) || std::isinf(trq[1]) ||
            std::isnan(trq[1]) || std::isinf(trq[2]) || std::isnan(trq[2])) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the torque"
                   " for object %d",
                   index);
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e %13e %13e", trq[0], trq[1], trq[2]);
        line += tempBuffer;
      }
    }

    snprintf(tempBuffer, 4096, "%10d %7s %s\n", index, type.c_str(),
             line.c_str());
    return std::string(tempBuffer);
  }